

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O2

void __thiscall llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  uint uVar1;
  void **__src;
  void **__first2;
  size_t __n;
  void **ppvVar2;
  void **ppvVar3;
  ulong uVar4;
  
  if (this == RHS) {
    return;
  }
  ppvVar3 = this->SmallArray;
  ppvVar2 = this->CurArray;
  __first2 = RHS->SmallArray;
  __src = RHS->CurArray;
  if (ppvVar2 != ppvVar3) {
    if (__src == __first2) {
      if ((ulong)RHS->NumNonEmpty != 0) {
        memmove(ppvVar3,__src,(ulong)RHS->NumNonEmpty << 3);
        ppvVar3 = this->SmallArray;
        ppvVar2 = this->CurArray;
      }
      uVar1 = RHS->CurArraySize;
      RHS->CurArraySize = this->CurArraySize;
      this->CurArraySize = uVar1;
      uVar1 = this->NumNonEmpty;
      this->NumNonEmpty = RHS->NumNonEmpty;
      RHS->NumNonEmpty = uVar1;
      uVar1 = this->NumTombstones;
      this->NumTombstones = RHS->NumTombstones;
      RHS->NumTombstones = uVar1;
      RHS->CurArray = ppvVar2;
      this->CurArray = ppvVar3;
      return;
    }
    this->CurArray = __src;
    RHS->CurArray = ppvVar2;
    uVar1 = this->CurArraySize;
    this->CurArraySize = RHS->CurArraySize;
    RHS->CurArraySize = uVar1;
    goto LAB_0012800e;
  }
  if (__src != __first2) {
    if ((ulong)this->NumNonEmpty != 0) {
      memmove(__first2,ppvVar2,(ulong)this->NumNonEmpty << 3);
      __first2 = RHS->SmallArray;
      __src = RHS->CurArray;
    }
    uVar1 = RHS->CurArraySize;
    RHS->CurArraySize = this->CurArraySize;
    this->CurArraySize = uVar1;
    uVar1 = RHS->NumNonEmpty;
    RHS->NumNonEmpty = this->NumNonEmpty;
    this->NumNonEmpty = uVar1;
    uVar1 = RHS->NumTombstones;
    RHS->NumTombstones = this->NumTombstones;
    this->NumTombstones = uVar1;
    this->CurArray = __src;
    RHS->CurArray = __first2;
    return;
  }
  uVar1 = this->NumNonEmpty;
  if (RHS->NumNonEmpty < this->NumNonEmpty) {
    uVar1 = RHS->NumNonEmpty;
  }
  uVar4 = (ulong)uVar1;
  std::swap_ranges<void_const**,void_const**>(ppvVar3,ppvVar3 + uVar4,__first2);
  if (uVar1 < this->NumNonEmpty) {
    ppvVar3 = this->SmallArray;
    __n = (this->NumNonEmpty - uVar4) * 8;
    ppvVar2 = RHS->SmallArray;
LAB_00128000:
    memmove(ppvVar2 + uVar4,ppvVar3 + uVar4,__n);
  }
  else {
    __n = (ulong)RHS->NumNonEmpty * 8 + uVar4 * -8;
    if (__n != 0) {
      ppvVar3 = RHS->SmallArray;
      ppvVar2 = this->SmallArray;
      goto LAB_00128000;
    }
  }
  if (this->CurArraySize != RHS->CurArraySize) {
    __assert_fail("this->CurArraySize == RHS.CurArraySize",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x10c,"void llvm::SmallPtrSetImplBase::swap(SmallPtrSetImplBase &)");
  }
LAB_0012800e:
  uVar1 = this->NumNonEmpty;
  this->NumNonEmpty = RHS->NumNonEmpty;
  RHS->NumNonEmpty = uVar1;
  uVar1 = this->NumTombstones;
  this->NumTombstones = RHS->NumTombstones;
  RHS->NumTombstones = uVar1;
  return;
}

Assistant:

void SmallPtrSetImplBase::swap(SmallPtrSetImplBase &RHS) {
  if (this == &RHS) return;

  // We can only avoid copying elements if neither set is small.
  if (!this->isSmall() && !RHS.isSmall()) {
    std::swap(this->CurArray, RHS.CurArray);
    std::swap(this->CurArraySize, RHS.CurArraySize);
    std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
    std::swap(this->NumTombstones, RHS.NumTombstones);
    return;
  }

  // FIXME: From here on we assume that both sets have the same small size.

  // If only RHS is small, copy the small elements into LHS and move the pointer
  // from LHS to RHS.
  if (!this->isSmall() && RHS.isSmall()) {
    assert(RHS.CurArray == RHS.SmallArray);
    std::copy(RHS.CurArray, RHS.CurArray + RHS.NumNonEmpty, this->SmallArray);
    std::swap(RHS.CurArraySize, this->CurArraySize);
    std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
    std::swap(this->NumTombstones, RHS.NumTombstones);
    RHS.CurArray = this->CurArray;
    this->CurArray = this->SmallArray;
    return;
  }

  // If only LHS is small, copy the small elements into RHS and move the pointer
  // from RHS to LHS.
  if (this->isSmall() && !RHS.isSmall()) {
    assert(this->CurArray == this->SmallArray);
    std::copy(this->CurArray, this->CurArray + this->NumNonEmpty,
              RHS.SmallArray);
    std::swap(RHS.CurArraySize, this->CurArraySize);
    std::swap(RHS.NumNonEmpty, this->NumNonEmpty);
    std::swap(RHS.NumTombstones, this->NumTombstones);
    this->CurArray = RHS.CurArray;
    RHS.CurArray = RHS.SmallArray;
    return;
  }

  // Both a small, just swap the small elements.
  assert(this->isSmall() && RHS.isSmall());
  unsigned MinNonEmpty = std::min(this->NumNonEmpty, RHS.NumNonEmpty);
  std::swap_ranges(this->SmallArray, this->SmallArray + MinNonEmpty,
                   RHS.SmallArray);
  if (this->NumNonEmpty > MinNonEmpty) {
    std::copy(this->SmallArray + MinNonEmpty,
              this->SmallArray + this->NumNonEmpty,
              RHS.SmallArray + MinNonEmpty);
  } else {
    std::copy(RHS.SmallArray + MinNonEmpty, RHS.SmallArray + RHS.NumNonEmpty,
              this->SmallArray + MinNonEmpty);
  }
  assert(this->CurArraySize == RHS.CurArraySize);
  std::swap(this->NumNonEmpty, RHS.NumNonEmpty);
  std::swap(this->NumTombstones, RHS.NumTombstones);
}